

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O1

void println(void)

{
  char cVar1;
  uint uVar2;
  long lVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  
  if (list_level == 0) {
    return;
  }
  if (xlist == 0) {
    return;
  }
  if (asm_opt[0] == 0) {
    return;
  }
  if ((expand_macro != 0) && (asm_opt[1] == 0)) {
    return;
  }
  if (continued_line != 0) {
    strcpy(prlnbuf,tmplnbuf);
  }
  if (data_loccnt != -1) {
    loadlc(data_loccnt,0);
    iVar5 = loccnt - data_loccnt;
    if (data_level <= list_level || iVar5 < 4) {
      if (0 < iVar5) {
        iVar6 = 0;
        iVar7 = 0;
        do {
          if ((long)bank < 0xf0) {
            uVar2 = (uint)rom[bank][data_loccnt];
            lVar3 = 2;
            do {
              cVar1 = (char)(uVar2 & 0xf);
              cVar4 = cVar1 + '0';
              if (9 < (uVar2 & 0xf)) {
                cVar4 = cVar1 + '7';
              }
              prlnbuf[lVar3 + (long)iVar7 * 3 + 0xf] = cVar4;
              uVar2 = uVar2 >> 4;
              lVar3 = lVar3 + -1;
            } while (lVar3 != 0);
          }
          else {
            (prlnbuf + (long)iVar7 * 3 + 0x10)[0] = '-';
            (prlnbuf + (long)iVar7 * 3 + 0x10)[1] = '-';
          }
          data_loccnt = data_loccnt + 1;
          iVar7 = iVar7 + 1;
          if (iVar7 == data_size) {
            iVar7 = 0;
            fprintf((FILE *)lst_fp,"%s\n",prlnbuf);
            builtin_strncpy(prlnbuf,"                          ",0x1a);
            prlnbuf[0x1b] = '\0';
            loadlc(data_loccnt,0);
          }
          iVar6 = iVar6 + 1;
        } while (iVar6 != iVar5);
        if (iVar7 != 0) goto LAB_0010fa14;
      }
      return;
    }
  }
LAB_0010fa14:
  fprintf((FILE *)lst_fp,"%s\n",prlnbuf);
  return;
}

Assistant:

void
println(void)
{
	int nb, cnt;
	int i;

	/* check if output possible */
	if (list_level == 0)
		return;
	if (!xlist || !asm_opt[OPT_LIST] || (expand_macro && !asm_opt[OPT_MACRO]))
		return;

	/* update line buffer if necessary */
	if (continued_line)
		strcpy(prlnbuf, tmplnbuf);

	/* output */
	if (data_loccnt == -1)
		/* line buffer */
		fprintf(lst_fp, "%s\n", prlnbuf);
	else {
		/* line buffer + data bytes */
		loadlc(data_loccnt, 0);

		/* number of bytes */
		nb = loccnt - data_loccnt;

		/* check level */
		if ((data_level > list_level) && (nb > 3))
			/* doesn't match */
			fprintf(lst_fp, "%s\n", prlnbuf);
		else {
			/* ok */
			cnt = 0;
			for (i = 0; i < nb; i++) {
				if (bank >= RESERVED_BANK) {
					prlnbuf[16 + (3*cnt)] = '-';
					prlnbuf[17 + (3*cnt)] = '-';
				}
				else {
					hexcon(2, rom[bank][data_loccnt], &prlnbuf[16 + (3*cnt)]);
				}
				data_loccnt++;
				cnt++;
				if (cnt == data_size) {
					cnt = 0;
					fprintf(lst_fp, "%s\n", prlnbuf);
					clearln();
					loadlc(data_loccnt, 0);
				}
			}
			if (cnt)
				fprintf(lst_fp, "%s\n", prlnbuf);
		}
	}
}